

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O0

bool __thiscall GraphViewer::setVertexColor(GraphViewer *this,int k,string *color)

{
  Connection *this_00;
  bool bVar1;
  undefined8 uVar2;
  string local_140 [55];
  allocator local_109;
  string local_108 [8];
  string str;
  char local_e8 [8];
  char buff [200];
  string *color_local;
  int k_local;
  GraphViewer *this_local;
  
  buff._192_8_ = color;
  uVar2 = std::__cxx11::string::c_str();
  sprintf(local_e8,"setVertexColor %d %s\n",(ulong)(uint)k,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,local_e8,&local_109);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  this_00 = this->con;
  std::__cxx11::string::string(local_140,local_108);
  bVar1 = Connection::sendMsg(this_00,(string *)local_140);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_108);
  return bVar1;
}

Assistant:

bool GraphViewer::setVertexColor(int k, string color) {
	char buff[200];
	sprintf(buff, "setVertexColor %d %s\n", k, color.c_str());
	string str(buff);
	return con->sendMsg(str);
}